

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuttonChenAdapter.cpp
# Opt level: O2

void __thiscall
OpenMD::SuttonChenAdapter::makeSuttonChen
          (SuttonChenAdapter *this,RealType c,RealType m,RealType n,RealType alpha,RealType epsilon)

{
  AtomType *this_00;
  bool bVar1;
  undefined1 local_68 [40];
  RealType local_40;
  RealType local_38;
  RealType local_30;
  RealType local_28;
  RealType local_20;
  
  bVar1 = isSuttonChen(this);
  if (bVar1) {
    AtomType::removeProperty(this->at_,(string *)SCtypeID_abi_cxx11_);
  }
  this_00 = this->at_;
  local_40 = c;
  local_38 = m;
  local_30 = n;
  local_28 = alpha;
  local_20 = epsilon;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::SCAtypeParameters>,std::__cxx11::string_const&,OpenMD::SCAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (SCAtypeParameters *)SCtypeID_abi_cxx11_);
  local_68._16_8_ = local_68._0_8_;
  local_68._24_8_ = local_68._8_8_;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = 0;
  AtomType::addProperty(this_00,(shared_ptr<OpenMD::GenericData> *)(local_68 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x18));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
  return;
}

Assistant:

void SuttonChenAdapter::makeSuttonChen(RealType c, RealType m, RealType n,
                                         RealType alpha, RealType epsilon) {
    if (isSuttonChen()) { at_->removeProperty(SCtypeID); }

    SCAtypeParameters scParam {};
    scParam.c       = c;
    scParam.m       = m;
    scParam.n       = n;
    scParam.alpha   = alpha;
    scParam.epsilon = epsilon;

    at_->addProperty(std::make_shared<SCAtypeData>(SCtypeID, scParam));
  }